

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

uint256 * ComputeTapleafHash(uint8_t leaf_version,Span<const_unsigned_char> script)

{
  long lVar1;
  HashWriter *this;
  Span<const_unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> *in_stack_ffffffffffffff38;
  HashWriter *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = HashWriter::operator<<(in_stack_ffffffffffffff48,(uchar *)in_RDI);
  Span<const_unsigned_char>::size(in_stack_ffffffffffffff38);
  CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_ffffffffffffff38,0x10203ad);
  HashWriter::operator<<(this,(CompactSizeWriter *)in_RDI);
  HashWriter::operator<<(this,in_RDI);
  HashWriter::GetSHA256(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint256 *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTapleafHash(uint8_t leaf_version, Span<const unsigned char> script)
{
    return (HashWriter{HASHER_TAPLEAF} << leaf_version << CompactSizeWriter(script.size()) << script).GetSHA256();
}